

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDecoder.cpp
# Opt level: O0

int ZXing::Pdf417::TextCompaction
              (vector<int,_std::allocator<int>_> *codewords,int codeIndex,Content *result)

{
  bool bVar1;
  const_reference pvVar2;
  reference pvVar3;
  string *psVar4;
  int iVar5;
  int in_ESI;
  size_type sVar6;
  vector<int,_std::allocator<int>_> *in_RDI;
  int code;
  bool end;
  int index;
  vector<int,_std::allocator<int>_> textCompactionData;
  allocator_type *in_stack_ffffffffffffff28;
  string *msg;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff30;
  string *this;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  value_type in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff5c;
  uint in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  byte local_89;
  string local_70 [32];
  int local_50;
  byte local_49;
  int local_48;
  undefined4 local_34;
  vector<int,_std::allocator<int>_> local_30;
  int local_c;
  vector<int,_std::allocator<int>_> *local_8;
  
  local_c = in_ESI;
  local_8 = in_RDI;
  std::vector<int,_std::allocator<int>_>::operator[](in_RDI,0);
  local_34 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x2bd340);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (value_type_conflict3 *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::allocator<int>::~allocator((allocator<int> *)0x2bd36e);
  local_48 = 0;
  local_49 = 0;
  while( true ) {
    iVar5 = local_c;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_8,0);
    local_89 = 0;
    if (iVar5 < *pvVar2) {
      local_89 = local_49 ^ 0xff;
    }
    if ((local_89 & 1) == 0) break;
    sVar6 = (size_type)local_c;
    local_c = local_c + 1;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_8,sVar6);
    iVar5 = *pvVar2;
    local_50 = iVar5;
    if (iVar5 < 900) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_48);
      *pvVar3 = iVar5 / 0x1e;
      iVar5 = local_50 % 0x1e;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)(local_48 + 1));
      *pvVar3 = iVar5;
      local_48 = local_48 + 2;
    }
    else if (iVar5 == 0x391) {
      sVar6 = (size_type)local_48;
      local_48 = local_48 + 1;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,sVar6);
      *pvVar3 = 0x391;
      while( true ) {
        in_stack_ffffffffffffff5c = local_c;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_8,0);
        in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 & 0xffffff;
        if (in_stack_ffffffffffffff5c < *pvVar2) {
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_8,(long)local_c);
          bVar1 = IsECI(*pvVar2);
          in_stack_ffffffffffffff60 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff60);
        }
        if ((char)(in_stack_ffffffffffffff60 >> 0x18) == '\0') break;
        in_stack_ffffffffffffff50 = local_c + 1;
        std::vector<int,_std::allocator<int>_>::operator[](local_8,(long)local_c);
        in_stack_ffffffffffffff54 =
             ProcessTextECI((vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                            (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                            in_stack_ffffffffffffff30,
                            (int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                            (int)in_stack_ffffffffffffff28);
        local_c = in_stack_ffffffffffffff54;
      }
      in_stack_ffffffffffffff44 = local_c;
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_8,0);
      in_stack_ffffffffffffff64 = iVar5;
      if (in_stack_ffffffffffffff44 < *pvVar2) {
        sVar6 = (size_type)local_c;
        local_c = local_c + 1;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](local_8,sVar6);
        in_stack_ffffffffffffff40 = *pvVar2;
        sVar6 = (size_type)local_48;
        local_48 = local_48 + 1;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,sVar6);
        *pvVar3 = in_stack_ffffffffffffff40;
        in_stack_ffffffffffffff64 = iVar5;
      }
    }
    else if (iVar5 - 0x39dU < 3) {
      in_stack_ffffffffffffff3c =
           ProcessTextECI((vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                          in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),
                          (int)in_stack_ffffffffffffff28);
      in_stack_ffffffffffffff64 = iVar5;
      local_c = in_stack_ffffffffffffff3c;
    }
    else {
      bVar1 = TerminatesCompaction(iVar5);
      in_stack_ffffffffffffff38 = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff38);
      if (!bVar1) {
        psVar4 = (string *)__cxa_allocate_exception(0x30);
        this = local_70;
        msg = psVar4;
        std::__cxx11::string::string(this);
        Error::Error((Error *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     (short)((ulong)this >> 0x30),(Type)((ulong)this >> 0x28),msg);
        __cxa_throw(psVar4,&Error::typeinfo,Error::~Error);
      }
      local_c = local_c + -1;
      local_49 = 1;
      in_stack_ffffffffffffff64 = iVar5;
    }
  }
  DecodeTextCompaction
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),in_stack_ffffffffffffff5c
             ,(Content *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  iVar5 = local_c;
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff30);
  return iVar5;
}

Assistant:

static int TextCompaction(const std::vector<int>& codewords, int codeIndex, Content& result)
{
	// 2 characters per codeword
	std::vector<int> textCompactionData((codewords[0] - codeIndex) * 2, 0);

	int index = 0;
	bool end = false;

	while ((codeIndex < codewords[0]) && !end) {
		int code = codewords[codeIndex++];
		if (code < TEXT_COMPACTION_MODE_LATCH) {
			textCompactionData[index] = code / 30;
			textCompactionData[index + 1] = code % 30;
			index += 2;
		} else {
			switch (code) {
			case MODE_SHIFT_TO_BYTE_COMPACTION_MODE:
				// The Mode Shift codeword 913 shall cause a temporary
				// switch from Text Compaction mode to Byte Compaction mode.
				// This switch shall be in effect for only the next codeword,
				// after which the mode shall revert to the prevailing sub-mode
				// of the Text Compaction mode. Codeword 913 is only available
				// in Text Compaction mode; its use is described in 5.4.2.4.
				textCompactionData[index++] = MODE_SHIFT_TO_BYTE_COMPACTION_MODE;
				// 5.5.3.1 allows ECIs anywhere in Text Compaction, including after a Shift to Byte
				while (codeIndex < codewords[0] && IsECI(codewords[codeIndex])) {
					codeIndex = ProcessTextECI(textCompactionData, index, codewords, codeIndex + 1, codewords[codeIndex]);
				}
				if (codeIndex < codewords[0])
					textCompactionData[index++] = codewords[codeIndex++]; // Byte to shift
				break;
			case ECI_CHARSET:
			case ECI_GENERAL_PURPOSE:
			case ECI_USER_DEFINED:
				codeIndex = ProcessTextECI(textCompactionData, index, codewords, codeIndex, code);
				break;
			default:
				if (!TerminatesCompaction(code))
					throw FormatError();

				codeIndex--;
				end = true;
				break;
			}
		}
	}
	DecodeTextCompaction(textCompactionData, index, result);
	return codeIndex;
}